

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void __thiscall
duckdb::ModeState<short,_duckdb::ModeStandard<short>_>::~ModeState
          (ModeState<short,_duckdb::ModeStandard<short>_> *this)

{
  _Hashtable<short,_std::pair<const_short,_duckdb::ModeAttr>,_std::allocator<std::pair<const_short,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  ColumnDataScanState *this_01;
  
  this_00 = &this->frequency_map->_M_h;
  if (this_00 !=
      (_Hashtable<short,_std::pair<const_short,_duckdb::ModeAttr>,_std::allocator<std::pair<const_short,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)0x0) {
    ::std::
    _Hashtable<short,_std::pair<const_short,_duckdb::ModeAttr>,_std::allocator<std::pair<const_short,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(this_00);
    operator_delete(this_00);
  }
  if (this->mode != (short *)0x0) {
    operator_delete(this->mode);
  }
  this_01 = this->scan;
  if (this_01 != (ColumnDataScanState *)0x0) {
    ColumnDataScanState::~ColumnDataScanState(this_01);
    operator_delete(this_01);
  }
  DataChunk::~DataChunk(&this->page);
  ::std::_Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::~_Vector_base
            ((_Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)this);
  return;
}

Assistant:

~ModeState() {
		if (frequency_map) {
			delete frequency_map;
		}
		if (mode) {
			delete mode;
		}
		if (scan) {
			delete scan;
		}
	}